

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

png_int_32 png_get_int_32(png_const_bytep buf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)*buf * 0x1000000;
  uVar3 = (uint)buf[3] | (uint)buf[1] << 0x10 | (uint)buf[2] << 8;
  uVar2 = uVar3 | uVar1;
  uVar3 = (int)(uVar1 + uVar3 + -1) >> 0x1f & uVar2;
  if (-1 < (int)uVar1) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

png_int_32 (PNGAPI
png_get_int_32)(png_const_bytep buf)
{
   png_uint_32 uval = png_get_uint_32(buf);
   if ((uval & 0x80000000) == 0) /* non-negative */
      return (png_int_32)uval;

   uval = (uval ^ 0xffffffff) + 1;  /* 2's complement: -x = ~x+1 */
   if ((uval & 0x80000000) == 0) /* no overflow */
      return -(png_int_32)uval;
   /* The following has to be safe; this function only gets called on PNG data
    * and if we get here that data is invalid.  0 is the most safe value and
    * if not then an attacker would surely just generate a PNG with 0 instead.
    */
   return 0;
}